

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void upb_Arena_ShrinkLast(upb_Arena *a,void *ptr,size_t oldsize,size_t size)

{
  _Bool _Var1;
  ulong uVar2;
  ulong oldsize_00;
  char *arena_ptr;
  size_t size_local;
  size_t oldsize_local;
  void *ptr_local;
  upb_Arena *a_local;
  
  if (ptr == (void *)0x0) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                  ,0x47,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
  }
  if (oldsize < size) {
    __assert_fail("size <= oldsize",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                  ,0x48,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
  }
  uVar2 = size + 7 & 0xfffffffffffffff8;
  oldsize_00 = oldsize + 7 & 0xfffffffffffffff8;
  if (uVar2 != oldsize_00) {
    if ((char *)((long)ptr + oldsize_00) == a->ptr_dont_copy_me__upb_internal_use_only) {
      a->ptr_dont_copy_me__upb_internal_use_only = (char *)((long)ptr + uVar2);
    }
    else {
      _Var1 = _upb_Arena_WasLastAlloc(a,ptr,oldsize_00);
      if (!_Var1) {
        __assert_fail("_upb_Arena_WasLastAlloc(a, ptr, oldsize)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x58,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)")
        ;
      }
    }
  }
  return;
}

Assistant:

UPB_API_INLINE void upb_Arena_ShrinkLast(struct upb_Arena* a, void* ptr,
                                         size_t oldsize, size_t size) {
  UPB_TSAN_CHECK_WRITE(a->UPB_ONLYBITS(ptr));
  UPB_ASSERT(ptr);
  UPB_ASSERT(size <= oldsize);
  size = UPB_ALIGN_MALLOC(size) + UPB_ASAN_GUARD_SIZE;
  oldsize = UPB_ALIGN_MALLOC(oldsize) + UPB_ASAN_GUARD_SIZE;
  if (size == oldsize) {
    return;
  }
  char* arena_ptr = a->UPB_ONLYBITS(ptr);
  // If it's the last alloc in the last block, we can resize.
  if ((char*)ptr + oldsize == arena_ptr) {
    a->UPB_ONLYBITS(ptr) = (char*)ptr + size;
  } else {
    // If not, verify that it could have been a full-block alloc that did not
    // replace the last block.
#ifndef NDEBUG
    bool _upb_Arena_WasLastAlloc(struct upb_Arena * a, void* ptr,
                                 size_t oldsize);
    UPB_ASSERT(_upb_Arena_WasLastAlloc(a, ptr, oldsize));
#endif
  }
  UPB_POISON_MEMORY_REGION((char*)ptr + (size - UPB_ASAN_GUARD_SIZE),
                           oldsize - size);
}